

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Block,_char> *b)

{
  JObject *pJVar1;
  ostream *poVar2;
  char local_3d [20];
  char local_29;
  JObject local_28;
  JSON<pstack::Dwarf::Block,_char> *local_18;
  JSON<pstack::Dwarf::Block,_char> *b_local;
  ostream *os_local;
  
  local_18 = b;
  b_local = (JSON<pstack::Dwarf::Block,_char> *)os;
  JObject::JObject(&local_28,os);
  local_29 = '\0';
  pJVar1 = JObject::field<char[7],unsigned_long,char>
                     (&local_28,(char (*) [7])0x2a84cd,&local_18->object->offset,&local_29);
  local_3d[0] = '\0';
  pJVar1 = JObject::field<char[7],unsigned_long,char>
                     (pJVar1,(char (*) [7])0x2a8675,&local_18->object->length,local_3d);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_28);
  return poVar2;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Block> &b)
{
    return JObject(os)
        .field("offset", b.object.offset)
        .field("length", b.object.length);
}